

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O3

int __thiscall icu_63::MessagePattern::init(MessagePattern *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  MessagePatternPartsList *pMVar2;
  Part *pPVar3;
  
  if (0 < *(int *)ctx) {
    return 0;
  }
  pMVar2 = (MessagePatternPartsList *)UMemory::operator_new((UMemory *)0x210,(size_t)ctx);
  if (pMVar2 == (MessagePatternPartsList *)0x0) {
    this->partsList = (MessagePatternPartsList *)0x0;
    *(undefined4 *)ctx = 7;
    iVar1 = 0;
  }
  else {
    memset(&(pMVar2->super_MessagePatternList<icu_63::MessagePattern::Part,_32>).a.capacity,0,0x208)
    ;
    pPVar3 = (pMVar2->super_MessagePatternList<icu_63::MessagePattern::Part,_32>).a.stackArray;
    (pMVar2->super_MessagePatternList<icu_63::MessagePattern::Part,_32>).a.ptr = pPVar3;
    (pMVar2->super_MessagePatternList<icu_63::MessagePattern::Part,_32>).a.capacity = 0x20;
    this->partsList = pMVar2;
    this->parts = pPVar3;
    iVar1 = (int)CONCAT71((int7)((ulong)pPVar3 >> 8),1);
  }
  return iVar1;
}

Assistant:

static
    inline UBool U_FAILURE(UErrorCode code) { return (UBool)(code>U_ZERO_ERROR); }